

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLReaderTest_ReadNumericConstant_Test::~NLReaderTest_ReadNumericConstant_Test
          (NLReaderTest_ReadNumericConstant_Test *this)

{
  void *in_RDI;
  
  ~NLReaderTest_ReadNumericConstant_Test((NLReaderTest_ReadNumericConstant_Test *)0x1a5328);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(NLReaderTest, ReadNumericConstant) {
  EXPECT_READ("c0: 4.2;", "C0\nn4.2\n");
  EXPECT_READ("c0: -100;", "C0\nn-1e+2\n");
  CheckReadInt<short>('s');
  if (sizeof(double) == 2 * sizeof(int))
    CheckReadInt<int>('l');
  else
    CheckReadInt<long>('l');
}